

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::ShortToStr(short *r)

{
  char *pcVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  short sVar5;
  short sVar6;
  char *pcVar7;
  NULLCArray NVar8;
  char buf [16];
  
  if (r == (short *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar8 = (NULLCArray)ZEXT812(0);
  }
  else {
    sVar2 = *r;
    sVar5 = sVar2 % 10;
    sVar3 = -sVar5;
    if (0 < sVar5) {
      sVar3 = sVar5;
    }
    buf[0] = (char)sVar3 + '0';
    pcVar7 = buf;
    sVar3 = sVar2;
    while (pcVar7 = pcVar7 + 1, 0x12 < (ushort)(sVar3 + 9U)) {
      sVar3 = sVar3 / 10;
      sVar6 = sVar3 % 10;
      sVar5 = -sVar6;
      if (0 < sVar6) {
        sVar5 = sVar6;
      }
      *pcVar7 = (char)sVar5 + '0';
    }
    if (sVar2 < 0) {
      *pcVar7 = '-';
      pcVar7 = pcVar7 + 1;
    }
    NVar8 = AllocArray(1,((int)pcVar7 - (int)buf) + 1,2);
    pcVar4 = NVar8.ptr;
    do {
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar7 + -1;
      *pcVar4 = *pcVar1;
      pcVar4 = pcVar4 + 1;
    } while (pcVar7 != buf);
  }
  return NVar8;
}

Assistant:

NULLCArray NULLC::ShortToStr(short* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	short number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}